

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darMan.c
# Opt level: O0

void Dar_ManPrintStats(Dar_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint local_3e4;
  double local_3e0;
  double local_3d0;
  uint local_390;
  int i;
  int Gain;
  uint pCanons [222];
  Dar_Man_t *p_local;
  
  iVar1 = p->nNodesInit;
  pCanons._880_8_ = p;
  iVar4 = Aig_ManNodeNum(p->pAig);
  uVar5 = iVar1 - iVar4;
  uVar2 = *(uint *)(pCanons._880_8_ + 0xab8);
  uVar3 = *(uint *)(pCanons._880_8_ + 0xab4);
  uVar6 = Aig_ManNodeNum(*(Aig_Man_t **)(pCanons._880_8_ + 8));
  printf("Tried = %8d. Beg = %8d. End = %8d. Gain = %6d. (%6.2f %%).  Cut mem = %d MB\n",
         ((double)(int)uVar5 * 100.0) / (double)*(int *)(pCanons._880_8_ + 0xab4),(ulong)uVar2,
         (ulong)uVar3,(ulong)uVar6,(ulong)uVar5,(ulong)*(uint *)(pCanons._880_8_ + 0xab0));
  uVar2 = *(uint *)(pCanons._880_8_ + 0xabc);
  uVar3 = *(uint *)(pCanons._880_8_ + 0xac0);
  uVar6 = *(uint *)(pCanons._880_8_ + 0xac4);
  uVar7 = *(uint *)(pCanons._880_8_ + 0xac8);
  uVar8 = *(uint *)(pCanons._880_8_ + 0xad0);
  iVar1 = *(int *)(pCanons._880_8_ + 0xac4);
  iVar4 = Aig_ManNodeNum(*(Aig_Man_t **)(pCanons._880_8_ + 8));
  printf("Cuts = %8d. Tried = %8d. Used = %8d. Bad = %5d. Skipped = %5d. Ave = %.2f.\n",
         (double)((float)iVar1 / (float)iVar4),(ulong)uVar2,(ulong)uVar3,(ulong)uVar6,(ulong)uVar7,
         (ulong)uVar8);
  uVar7 = Aig_ManBufNum(*(Aig_Man_t **)(pCanons._880_8_ + 8));
  uVar2 = *(uint *)(*(long *)(pCanons._880_8_ + 8) + 0xd0);
  uVar3 = *(uint *)(*(long *)(pCanons._880_8_ + 8) + 200);
  uVar6 = *(uint *)(*(long *)(pCanons._880_8_ + 8) + 0xcc);
  uVar8 = Aig_ManLevels(*(Aig_Man_t **)(pCanons._880_8_ + 8));
  printf("Bufs = %5d. BufMax = %5d. BufReplace = %6d. BufFix = %6d.  Levels = %4d.\n",(ulong)uVar7,
         (ulong)uVar2,(ulong)uVar3,(ulong)uVar6,(ulong)uVar8);
  Abc_Print(1,"%s =","Cuts  ");
  Abc_Print(1,"%9.2f sec\n",((double)*(long *)(pCanons._880_8_ + 0xad8) * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Eval  ");
  Abc_Print(1,"%9.2f sec\n",((double)*(long *)(pCanons._880_8_ + 0xae0) * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Other ");
  Abc_Print(1,"%9.2f sec\n",((double)*(long *)(pCanons._880_8_ + 0xae8) * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","TOTAL ");
  Abc_Print(1,"%9.2f sec\n",((double)*(long *)(pCanons._880_8_ + 0xaf0) * 1.0) / 1000000.0);
  if (*(int *)(*(long *)pCanons._880_8_ + 0x20) != 0) {
    Dar_LibReturnCanonicals((uint *)&i);
    for (local_390 = 0; (int)local_390 < 0xde; local_390 = local_390 + 1) {
      if ((*(int *)(pCanons._880_8_ + 0x3c0 + (long)(int)local_390 * 4) != 0) ||
         (*(int *)(pCanons._880_8_ + 0x48 + (long)(int)local_390 * 4) != 0)) {
        printf("%3d : ",(ulong)local_390);
        if (uVar5 == 0) {
          local_3d0 = 0.0;
        }
        else {
          local_3d0 = ((double)*(int *)(pCanons._880_8_ + 0x3c0 + (long)(int)local_390 * 4) * 100.0)
                      / (double)(int)uVar5;
        }
        printf("G = %6d (%5.2f %%)  ",local_3d0,
               (ulong)*(uint *)(pCanons._880_8_ + 0x3c0 + (long)(int)local_390 * 4));
        if (*(int *)(pCanons._880_8_ + 0x44) == 0) {
          local_3e0 = 0.0;
        }
        else {
          local_3e0 = ((double)*(int *)(pCanons._880_8_ + 0x738 + (long)(int)local_390 * 4) * 100.0)
                      / (double)*(int *)(pCanons._880_8_ + 0x44);
        }
        printf("S = %8d (%5.2f %%)  ",local_3e0,
               (ulong)*(uint *)(pCanons._880_8_ + 0x738 + (long)(int)local_390 * 4));
        if (*(int *)(pCanons._880_8_ + 0x3c0 + (long)(int)local_390 * 4) == 0) {
          local_3e4 = 9999999;
        }
        else {
          local_3e4 = *(int *)(pCanons._880_8_ + 0x738 + (long)(int)local_390 * 4) /
                      *(int *)(pCanons._880_8_ + 0x3c0 + (long)(int)local_390 * 4);
        }
        printf("R = %7d   ",(ulong)local_3e4);
        printf("\n");
      }
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

void Dar_ManPrintStats( Dar_Man_t * p )
{
    unsigned pCanons[222];
    int Gain, i;
    extern void Kit_DsdPrintFromTruth( unsigned * pTruth, int nVars );

    Gain = p->nNodesInit - Aig_ManNodeNum(p->pAig);
    printf( "Tried = %8d. Beg = %8d. End = %8d. Gain = %6d. (%6.2f %%).  Cut mem = %d MB\n", 
        p->nNodesTried, p->nNodesInit, Aig_ManNodeNum(p->pAig), Gain, 100.0*Gain/p->nNodesInit, p->nCutMemUsed );
    printf( "Cuts = %8d. Tried = %8d. Used = %8d. Bad = %5d. Skipped = %5d. Ave = %.2f.\n", 
        p->nCutsAll, p->nCutsTried, p->nCutsUsed, p->nCutsBad, p->nCutsSkipped,
        (float)p->nCutsUsed/Aig_ManNodeNum(p->pAig) );

    printf( "Bufs = %5d. BufMax = %5d. BufReplace = %6d. BufFix = %6d.  Levels = %4d.\n", 
        Aig_ManBufNum(p->pAig), p->pAig->nBufMax, p->pAig->nBufReplaces, p->pAig->nBufFixes, Aig_ManLevels(p->pAig) );
    ABC_PRT( "Cuts  ", p->timeCuts );
    ABC_PRT( "Eval  ", p->timeEval );
    ABC_PRT( "Other ", p->timeOther );
    ABC_PRT( "TOTAL ", p->timeTotal );

    if ( !p->pPars->fVeryVerbose )
        return;
    Dar_LibReturnCanonicals( pCanons );
    for ( i = 0; i < 222; i++ )
    {
        if ( p->ClassGains[i] == 0 && p->ClassTimes[i] == 0 )
            continue;
        printf( "%3d : ", i );
        printf( "G = %6d (%5.2f %%)  ", p->ClassGains[i], Gain? 100.0*p->ClassGains[i]/Gain : 0.0 );
        printf( "S = %8d (%5.2f %%)  ", p->ClassSubgs[i], p->nTotalSubgs? 100.0*p->ClassSubgs[i]/p->nTotalSubgs : 0.0 );
        printf( "R = %7d   ", p->ClassGains[i]? p->ClassSubgs[i]/p->ClassGains[i] : 9999999 );
//        Kit_DsdPrintFromTruth( pCanons + i, 4 );
//        ABC_PRTP( "T", p->ClassTimes[i], p->timeEval );
        printf( "\n" );
    }
    fflush( stdout );
}